

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O2

int __thiscall Fl_Window_Type::handle(Fl_Window_Type *this,int event)

{
  int iVar1;
  uint uVar2;
  Fl_Group *pFVar3;
  Fl_Widget *pFVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  Fl_Type *pFVar8;
  Fl_Menu_Item *pFVar9;
  Fl_Group *pFVar10;
  int t_1;
  uint uVar11;
  fd_set *pfVar12;
  fd_set *__exceptfds;
  int t;
  uint uVar13;
  fd_set *extraout_RDX;
  fd_set *__writefds;
  fd_set *__writefds_00;
  fd_set *extraout_RDX_00;
  fd_set *extraout_RDX_01;
  fd_set *extraout_RDX_02;
  fd_set *__writefds_01;
  char *__file;
  ulong uVar14;
  fd_set *pfVar15;
  Fl_Window_Type *pFVar16;
  timeval *in_R8;
  int iVar17;
  Fl_Widget_Type *myo;
  Fl_Type **ppFVar18;
  Fl_Window_Type *pFVar19;
  Fl_Window_Type *pFVar20;
  undefined4 extraout_var;
  
  iVar7 = Fl::e_state;
  iVar6 = Fl::e_x;
  uVar13 = 0;
  __file = (char *)(ulong)(event - 1U);
  if (0xb < event - 1U) {
    return 0;
  }
  pfVar12 = (fd_set *)
            ((long)&switchD_0018d744::switchdataD_0020c178 +
            (long)(int)(&switchD_0018d744::switchdataD_0020c178)[(long)__file]);
  switch(__file) {
  case (char *)0x0:
    this->mx = Fl::e_x;
    this->x1 = iVar6;
    iVar7 = Fl::e_y;
    this->my = Fl::e_y;
    this->y1 = iVar7;
    this->dx = 0;
    this->dy = 0;
    this->drag = 0;
    pFVar19 = this;
    pFVar16 = this;
    if (Fl::e_keysym < 0xfeeb) {
LAB_0018d92e:
      do {
        handle::selection = (Fl_Type *)pFVar16;
        pFVar19 = (Fl_Window_Type *)(pFVar19->super_Fl_Widget_Type).super_Fl_Type.next;
        if ((pFVar19 == (Fl_Window_Type *)0x0) ||
           ((pFVar19->super_Fl_Widget_Type).super_Fl_Type.level <=
            (this->super_Fl_Widget_Type).super_Fl_Type.level)) goto LAB_0018d99b;
        iVar6 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar19);
        pFVar16 = (Fl_Window_Type *)handle::selection;
        if ((iVar6 != 0) &&
           (iVar6 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])(pFVar19),
           pFVar16 = (Fl_Window_Type *)handle::selection, iVar6 == 0)) {
          pFVar3 = (Fl_Group *)(pFVar19->super_Fl_Widget_Type).o;
          for (pFVar10 = pFVar3; pFVar10 != (Fl_Group *)0x0;
              pFVar10 = (pFVar10->super_Fl_Widget).parent_) {
            if (((pFVar10->super_Fl_Widget).flags_ & 2) != 0) goto LAB_0018d92e;
          }
          iVar6 = Fl::event_inside((Fl_Widget *)pFVar3);
          pFVar16 = (Fl_Window_Type *)handle::selection;
          if ((iVar6 != 0) && (pFVar16 = pFVar19, Fl::e_clicks == 1)) {
            handle::selection = (Fl_Type *)pFVar19;
            reveal_in_browser((Fl_Type *)pFVar19);
            pFVar16 = (Fl_Window_Type *)handle::selection;
          }
        }
      } while( true );
    }
    in_this_only = (Fl_Type *)this;
    pFVar9 = Fl_Menu_Item::popup(New_Menu,iVar6,iVar7,"New",handle::myprev,(Fl_Menu_ *)0x0);
    if ((pFVar9 != (Fl_Menu_Item *)0x0) && (pFVar9->callback_ != (Fl_Callback *)0x0)) {
      handle::myprev = pFVar9;
      (*pFVar9->callback_)((this->super_Fl_Widget_Type).o,pFVar9->user_data_);
    }
    in_this_only = (Fl_Type *)0x0;
    break;
  case (char *)0x1:
    if (this->drag == 0) {
      return 0;
    }
    this->mx = Fl::e_x;
    iVar7 = Fl::e_y;
    this->my = Fl::e_y;
    iVar1 = Fl::e_state;
    if (this->drag == 0x20) {
LAB_0018d86f:
      iVar17 = 0x2a078c;
      if ((Fl::e_clicks == 0) && (iVar17 = 0x2a0788, ((uint)Fl::e_state >> 0x12 & 1) == 0)) {
        uVar13 = this->x1;
        pfVar12 = (fd_set *)(ulong)uVar13;
        if (iVar6 < (int)uVar13) {
          this->x1 = iVar6;
          this->mx = uVar13;
        }
        uVar13 = this->y1;
        __exceptfds = (fd_set *)(ulong)uVar13;
        if (iVar7 < (int)uVar13) {
          this->y1 = iVar7;
          this->my = uVar13;
        }
        if (((uint)iVar1 >> 0x10 & 1) == 0) {
          deselect();
          pfVar12 = extraout_RDX;
        }
        else {
          Fl::e_is_click = 0;
        }
        iVar6 = 0;
        pFVar19 = this;
LAB_0018dcc1:
        do {
          pFVar19 = (Fl_Window_Type *)(pFVar19->super_Fl_Widget_Type).super_Fl_Type.next;
          if ((pFVar19 == (Fl_Window_Type *)0x0) ||
             ((pFVar19->super_Fl_Widget_Type).super_Fl_Type.level <=
              (this->super_Fl_Widget_Type).super_Fl_Type.level)) goto LAB_0018dd89;
          iVar7 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar19);
          pfVar12 = extraout_RDX_00;
          if ((iVar7 != 0) &&
             (iVar7 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])(pFVar19),
             pfVar12 = extraout_RDX_01, iVar7 == 0)) {
            pFVar3 = (Fl_Group *)(pFVar19->super_Fl_Widget_Type).o;
            for (pFVar10 = pFVar3; pFVar10 != (Fl_Group *)0x0;
                pFVar10 = (pFVar10->super_Fl_Widget).parent_) {
              if (((pFVar10->super_Fl_Widget).flags_ & 2) != 0) goto LAB_0018dcc1;
            }
            iVar7 = Fl::event_inside((Fl_Widget *)pFVar3);
            if (iVar7 != 0) {
              handle::selection = (Fl_Type *)pFVar19;
            }
            pFVar4 = (pFVar19->super_Fl_Widget_Type).o;
            uVar13 = pFVar4->x_;
            pfVar12 = (fd_set *)(ulong)uVar13;
            if (this->x1 <= (int)uVar13) {
              uVar11 = pFVar4->y_;
              __exceptfds = (fd_set *)(ulong)uVar11;
              if (((this->y1 < (int)uVar11) &&
                  (uVar13 = uVar13 + pFVar4->w_, pfVar12 = (fd_set *)(ulong)uVar13,
                  (int)uVar13 < this->mx)) &&
                 (uVar11 = uVar11 + pFVar4->h_, __exceptfds = (fd_set *)(ulong)uVar11,
                 (int)uVar11 < this->my)) {
                pfVar15 = (fd_set *)&DAT_00000001;
                if (((uint)iVar1 >> 0x10 & 1) != 0) {
                  pfVar15 = (fd_set *)
                            (ulong)((pFVar19->super_Fl_Widget_Type).super_Fl_Type.selected == '\0');
                }
                iVar6 = iVar6 + 1;
                select((int)pFVar19,pfVar15,pfVar12,__exceptfds,in_R8);
                pfVar12 = extraout_RDX_02;
              }
            }
          }
        } while( true );
      }
      Fl_Widget_Type::open(&this->super_Fl_Widget_Type,__file,iVar17);
    }
    else if (this->dy == 0 && this->dx == 0) {
      if (Fl::e_is_click != 0) goto LAB_0018d86f;
    }
    else {
      moveallchildren(this);
    }
LAB_0018ddc6:
    this->drag = 0;
    Fl_Overlay_Window::redraw_overlay((Fl_Overlay_Window *)(this->super_Fl_Widget_Type).o);
    break;
  default:
    goto switchD_0018d744_caseD_2;
  case (char *)0x4:
    if (this->drag == 0) {
      return 0;
    }
    this->mx = Fl::e_x;
    this->my = Fl::e_y;
    newdx(this);
    break;
  case (char *)0x7:
    iVar6 = 0;
    pfVar12 = (fd_set *)(ulong)(Fl::e_keysym - 0xff51);
    switch(pfVar12) {
    case (fd_set *)0x0:
      iVar7 = -1;
      break;
    case (fd_set *)0x1:
      iVar6 = -1;
      goto LAB_0018dbbd;
    case (fd_set *)0x2:
      iVar7 = 1;
      break;
    case (fd_set *)0x3:
      iVar6 = 1;
LAB_0018dbbd:
      iVar7 = 0;
      break;
    default:
      if (Fl::e_keysym == 0x6f) {
        toggle_overlays((Fl_Widget *)this,__file);
        goto switchD_0018d744_caseD_b;
      }
      if (Fl::e_keysym == 0xff09) {
        ppFVar18 = &Fl_Type::current;
        while( true ) {
          pFVar19 = (Fl_Window_Type *)*ppFVar18;
          if (pFVar19 == (Fl_Window_Type *)0x0) {
            return 0;
          }
          iVar6 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar19);
          if ((iVar6 != 0) &&
             (iVar6 = (*(pFVar19->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])(pFVar19),
             pFVar16 = pFVar19, iVar6 == 0)) break;
          ppFVar18 = &(pFVar19->super_Fl_Widget_Type).super_Fl_Type.parent;
        }
        do {
          pFVar16 = (Fl_Window_Type *)(pFVar16->super_Fl_Widget_Type).super_Fl_Type.parent;
          if (pFVar16 == (Fl_Window_Type *)0x0) break;
        } while (pFVar16 != this);
        if ((pFVar16 == (Fl_Window_Type *)0x0) ||
           (iVar6 = (*(pFVar16->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(),
           iVar6 == 0)) {
          pFVar19 = (Fl_Window_Type *)(this->super_Fl_Widget_Type).super_Fl_Type.next;
          if (pFVar19 == (Fl_Window_Type *)0x0) {
            return 0;
          }
          if ((pFVar19->super_Fl_Widget_Type).super_Fl_Type.level <=
              (this->super_Fl_Widget_Type).super_Fl_Type.level) {
            return 0;
          }
        }
        pFVar16 = pFVar19;
        do {
          pFVar16 = *(Fl_Window_Type **)
                     ((long)(pFVar16->super_Fl_Widget_Type).extra_code_ +
                     (((ulong)((uint)iVar7 >> 0xd & 8) | 0x50) - 0x78));
          pFVar20 = pFVar19;
          if ((pFVar16 == (Fl_Window_Type *)0x0) ||
             ((pFVar16->super_Fl_Widget_Type).super_Fl_Type.level <=
              (this->super_Fl_Widget_Type).super_Fl_Type.level)) break;
          iVar6 = (*(pFVar16->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x17])(pFVar16);
        } while ((iVar6 == 0) ||
                (iVar6 = (*(pFVar16->super_Fl_Widget_Type).super_Fl_Type._vptr_Fl_Type[0x1e])
                                   (pFVar16), pFVar20 = pFVar16, iVar6 != 0));
        deselect();
        select((int)pFVar20,(fd_set *)&DAT_00000001,__writefds_01,pfVar12,in_R8);
        return 1;
      }
      if (Fl::e_keysym != 0xff1b) {
        return 0;
      }
      (*((this->super_Fl_Widget_Type).o)->_vptr_Fl_Widget[6])();
      goto LAB_0018ddd9;
    }
    this->dx = iVar7;
    this->dy = iVar6;
    iVar17 = Fl::e_state;
    iVar1 = 10;
    if (((uint)Fl::e_state >> 0x10 & 1) == 0) {
      iVar1 = 0x10;
    }
    this->drag = iVar1;
    if (((uint)iVar17 >> 0x12 & 1) != 0) {
      this->dx = iVar7 * gridx;
      this->dy = iVar6 * gridy;
    }
    moveallchildren(this);
    pFVar8 = handle::selection;
LAB_0018dc16:
    handle::selection = pFVar8;
    this->drag = 0;
    break;
  case (char *)0xb:
switchD_0018d744_caseD_b:
    in_this_only = (Fl_Type *)this;
    pFVar9 = Fl_Menu_Item::test_shortcut(Main_Menu);
    if ((pFVar9 != (Fl_Menu_Item *)0x0) && (pFVar9->callback_ != (Fl_Callback *)0x0)) {
      (*pFVar9->callback_)((this->super_Fl_Widget_Type).o,pFVar9->user_data_);
    }
    uVar13 = (uint)(pFVar9 != (Fl_Menu_Item *)0x0);
    in_this_only = (Fl_Type *)0x0;
    goto switchD_0018d744_caseD_2;
  }
LAB_0018ddd9:
  uVar13 = 1;
switchD_0018d744_caseD_2:
  return uVar13;
LAB_0018dd89:
  if (iVar6 == 0) {
    if (((uint)iVar1 >> 0x10 & 1) == 0) {
      pfVar15 = (fd_set *)&DAT_00000001;
    }
    else {
      pfVar15 = (fd_set *)(ulong)(handle::selection->selected == '\0');
    }
    select((int)handle::selection,pfVar15,pfVar12,__exceptfds,in_R8);
  }
  goto LAB_0018ddc6;
LAB_0018d99b:
  if (this->numselected == 0) {
    uVar14 = (ulong)(uint)this->mx;
  }
  else {
    uVar13 = this->mx;
    uVar14 = (ulong)uVar13;
    if ((Fl::e_state & 0x10000U) == 0) {
      iVar6 = this->br;
      pfVar12 = (fd_set *)(ulong)(uint)(snap + iVar6);
      if ((int)uVar13 <= snap + iVar6) {
        iVar7 = this->bx;
        pfVar12 = (fd_set *)(ulong)(uint)(iVar7 - snap);
        if (iVar7 - snap <= (int)uVar13) {
          uVar11 = this->my;
          pfVar12 = (fd_set *)(ulong)uVar11;
          iVar1 = this->bt;
          if ((int)uVar11 <= iVar1 + snap) {
            uVar2 = this->by;
            in_R8 = (timeval *)(ulong)uVar2;
            if ((int)(uVar2 - snap) <= (int)uVar11) {
              iVar17 = 5;
              if (5 < snap) {
                iVar17 = snap;
              }
              iVar5 = (iVar6 - iVar7) / 4;
              if (iVar17 <= iVar5) {
                iVar5 = iVar17;
              }
              if ((int)uVar13 < iVar6 - iVar5) {
                if ((int)uVar13 < iVar5 + iVar7) {
                  uVar13 = 1;
                  goto LAB_0018dde9;
                }
              }
              else {
                uVar13 = 2;
LAB_0018dde9:
                this->drag = this->drag | uVar13;
              }
              iVar6 = (int)(iVar1 - uVar2) / 4;
              if (iVar6 < iVar17) {
                iVar17 = iVar6;
              }
              in_R8 = (timeval *)(ulong)(uVar2 + iVar17);
              if ((int)(uVar2 + iVar17) < (int)uVar11) {
                if (iVar1 - iVar17 < (int)uVar11) {
                  this->drag = this->drag | 4;
                }
                else if (this->drag == 0) {
                  this->drag = 0x10;
                }
              }
              else {
                *(byte *)&this->drag = (byte)this->drag | 8;
              }
            }
          }
        }
      }
    }
  }
  iVar6 = (*handle::selection->_vptr_Fl_Type[7])(handle::selection,uVar14,(ulong)(uint)this->my);
  pFVar8 = (Fl_Type *)CONCAT44(extraout_var,iVar6);
  if (pFVar8 == (Fl_Type *)0x0) {
    if (this->drag != 0) {
      return 1;
    }
    this->drag = 0x20;
    return 1;
  }
  if ((Fl::e_state & 0x10000U) == 0) {
    deselect();
    select(iVar6,(fd_set *)&DAT_00000001,__writefds_00,pfVar12,in_R8);
    iVar6 = (*pFVar8->_vptr_Fl_Type[0x1e])(pFVar8);
    if (iVar6 != 0) {
      (*pFVar8->_vptr_Fl_Type[0xb])(pFVar8);
    }
  }
  else {
    Fl::e_is_click = 0;
    select(iVar6,(fd_set *)(ulong)(pFVar8->selected == '\0'),__writefds,pfVar12,in_R8);
  }
  goto LAB_0018dc16;
}

Assistant:

int Fl_Window_Type::handle(int event) {
  static Fl_Type* selection;
  switch (event) {
  case FL_PUSH:
    x1 = mx = Fl::event_x();
    y1 = my = Fl::event_y();
    drag = dx = dy = 0;
    // test for popup menu:
    if (Fl::event_button() >= 3) {
      in_this_only = this; // modifies how some menu items work.
      static const Fl_Menu_Item* myprev;
      const Fl_Menu_Item* m = New_Menu->popup(mx,my,"New",myprev);
      if (m && m->callback()) {myprev = m; m->do_callback(this->o);}
      in_this_only = 0;
      return 1;
    }
    // find the innermost item clicked on:
    selection = this;
    {for (Fl_Type* i=next; i && i->level>level; i=i->next)
      if (i->is_widget() && !i->is_menu_item()) {
      Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
      for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	if (!o1->visible()) goto CONTINUE2;
      if (Fl::event_inside(myo->o)) {
        selection = myo;
        if (Fl::event_clicks()==1)
          reveal_in_browser(myo);
      }
    CONTINUE2:;
    }}
    // see if user grabs edges of selected region:
    if (numselected && !(Fl::event_state(FL_SHIFT)) &&
	mx<=br+snap && mx>=bx-snap && my<=bt+snap && my>=by-snap) {
      int snap1 = snap>5 ? snap : 5;
      int w1 = (br-bx)/4; if (w1 > snap1) w1 = snap1;
      if (mx>=br-w1) drag |= RIGHT;
      else if (mx<bx+w1) drag |= LEFT;
      w1 = (bt-by)/4; if (w1 > snap1) w1 = snap1;
      if (my<=by+w1) drag |= TOP;
      else if (my>bt-w1) drag |= BOTTOM;
      if (!drag) drag = DRAG;
    }
    // do object-specific selection of other objects:
    {Fl_Type* t = selection->click_test(mx, my);
    if (t) {
      //if (t == selection) return 1; // indicates mouse eaten w/o change
      if (Fl::event_state(FL_SHIFT)) {
	Fl::event_is_click(0);
	select(t, !t->selected);
      } else {
	deselect();
	select(t, 1);
	if (t->is_menu_item()) t->open();
      }
      selection = t;
      drag = 0;
    } else {
      if (!drag) drag = BOX; // if all else fails, start a new selection region
    }}
    return 1;

  case FL_DRAG:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    newdx();
    return 1;

  case FL_RELEASE:
    if (!drag) return 0;
    mx = Fl::event_x();
    my = Fl::event_y();
    if (drag != BOX && (dx || dy || !Fl::event_is_click())) {
      if (dx || dy) moveallchildren();
    } else if ((Fl::event_clicks() || Fl::event_state(FL_CTRL))) {
      Fl_Widget_Type::open();
    } else {
      if (mx<x1) {int t = x1; x1 = mx; mx = t;}
      if (my<y1) {int t = y1; y1 = my; my = t;}
      int n = 0;
      int toggle = Fl::event_state(FL_SHIFT);
      // clear selection on everything:
      if (!toggle) deselect(); else Fl::event_is_click(0);
      // select everything in box:
      for (Fl_Type*i=next; i&&i->level>level; i=i->next)
	if (i->is_widget() && !i->is_menu_item()) {
	Fl_Widget_Type* myo = (Fl_Widget_Type*)i;
	for (Fl_Widget *o1 = myo->o; o1; o1 = o1->parent())
	  if (!o1->visible()) goto CONTINUE;
	if (Fl::event_inside(myo->o)) selection = myo;
	if (myo->o->x()>=x1 && myo->o->y()>y1 &&
	    myo->o->x()+myo->o->w()<mx && myo->o->y()+myo->o->h()<my) {
	  n++;
	  select(myo, toggle ? !myo->selected : 1);
	}
      CONTINUE:;
      }
      // if nothing in box, select what was clicked on:
      if (!n) {
	select(selection, toggle ? !selection->selected : 1);
      }
    }
    drag = 0;
    ((Overlay_Window *)o)->redraw_overlay();
    return 1;

  case FL_KEYBOARD: {

    int backtab = 0;
    switch (Fl::event_key()) {

    case FL_Escape:
      ((Fl_Window*)o)->hide();
      return 1;

    case FL_Tab: {
      if (Fl::event_state(FL_SHIFT)) backtab = 1;
      // find current child:
      Fl_Type *i = Fl_Type::current;
      while (i && (!i->is_widget() || i->is_menu_item())) i = i->parent;
      if (!i) return 0;
      Fl_Type *p = i->parent;
      while (p && p != this) p = p->parent;
      if (!p || !p->is_widget()) {
	i = next; if (!i || i->level <= level) return 0;
      }
      p = i;
      for (;;) {
	i = backtab ? i->prev : i->next;
	if (!i || i->level <= level) {i = p; break;}
	if (i->is_widget() && !i->is_menu_item()) break;
      }
      deselect(); select(i,1);
      return 1;}

    case FL_Left:  dx = -1; dy = 0; goto ARROW;
    case FL_Right: dx = +1; dy = 0; goto ARROW;
    case FL_Up:    dx = 0; dy = -1; goto ARROW;
    case FL_Down:  dx = 0; dy = +1; goto ARROW;
    ARROW:
      // for some reason BOTTOM/TOP are swapped... should be fixed...
      drag = (Fl::event_state(FL_SHIFT)) ? (RIGHT|TOP) : DRAG;
      if (Fl::event_state(FL_CTRL)) {dx *= gridx; dy *= gridy;}
      moveallchildren();
      drag = 0;
      return 1;

    case 'o':
      toggle_overlays(0, 0);
      break;

    default:
      return 0;
    }}

  case FL_SHORTCUT: {
    in_this_only = this; // modifies how some menu items work.
    const Fl_Menu_Item* m = Main_Menu->test_shortcut();
    if (m && m->callback()) m->do_callback(this->o);
    in_this_only = 0;
    return (m != 0);}

  default:
    return 0;
  }
}